

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

decimal_fp<float> fmt::v10::detail::dragonbox::to_decimal<float>(float x)

{
  decimal_fp<float> dVar1;
  bool bVar2;
  compute_mul_parity_result cVar3;
  uint uVar4;
  carrier_uint cVar5;
  int iVar6;
  int iVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint uVar10;
  compute_mul_result cVar11;
  decimal_fp<float> dVar12;
  carrier_uint local_f0;
  bool local_bc;
  bool bStack_bb;
  uint local_b8;
  compute_mul_parity_result y_mul;
  bool divisible_by_small_divisor;
  bool approx_y_parity;
  uint32_t dist;
  uint32_t uStack_ac;
  compute_mul_parity_result x_mul;
  uint32_t r;
  compute_mul_result z_mul;
  carrier_uint two_fc;
  uint32_t deltai;
  int beta;
  cache_entry_type cache;
  byte local_86;
  byte local_85;
  int minus_k;
  bool include_right_endpoint;
  uint uStack_80;
  bool include_left_endpoint;
  int exponent;
  carrier_uint significand;
  carrier_uint significand_mask;
  uint br;
  float x_local;
  decimal_fp<float> ret_value;
  carrier_uint zi;
  carrier_uint xi;
  cache_entry_type cache_1;
  int beta_1;
  int minus_k_1;
  int iStack_48;
  decimal_fp<float> ret_value_1;
  uint32_t q;
  uint32_t q_1;
  uint32_t mod_inv_25;
  uint32_t mod_inv_5;
  uint32_t q_2;
  uint32_t q_3;
  uint32_t mod_inv_25_1;
  uint32_t mod_inv_5_1;
  
  significand_mask = (carrier_uint)x;
  uVar4 = bit_cast<unsigned_int,_float,_0>((float *)&significand_mask);
  exponent = 0x7fffff;
  uStack_80 = uVar4 & 0x7fffff;
  significand = uVar4;
  cVar5 = exponent_mask<float>();
  iVar6 = num_significand_bits<float>();
  minus_k = (uVar4 & cVar5) >> ((byte)iVar6 & 0x1f);
  if (minus_k == 0) {
    if (uStack_80 == 0) {
      dVar12.significand = 0;
      dVar12.exponent = 0;
      return dVar12;
    }
    iVar6 = num_significand_bits<float>();
    minus_k = -0x7e - iVar6;
  }
  else {
    iVar6 = exponent_bias<float>();
    iVar7 = num_significand_bits<float>();
    minus_k = minus_k - (iVar6 + iVar7);
    if (uStack_80 == 0) {
      beta_1 = minus_k;
      cache_1._4_4_ = floor_log10_pow2_minus_log10_4_over_3(minus_k);
      iVar6 = beta_1;
      iVar7 = floor_log2_pow10(-cache_1._4_4_);
      cache_1._0_4_ = iVar6 + iVar7;
      _zi = cache_accessor<float>::get_cached_power(-cache_1._4_4_);
      ret_value.exponent =
           cache_accessor<float>::compute_left_endpoint_for_shorter_interval_case
                     ((cache_entry_type *)&zi,(int)cache_1);
      ret_value.significand =
           cache_accessor<float>::compute_right_endpoint_for_shorter_interval_case
                     ((cache_entry_type *)&zi,(int)cache_1);
      bVar2 = is_left_endpoint_integer_shorter_interval<float>(beta_1);
      if (!bVar2) {
        ret_value.exponent = ret_value.exponent + 1;
      }
      minus_k_1 = ret_value.significand / 10;
      if ((uint)(minus_k_1 * 10) < (uint)ret_value.exponent) {
        local_f0 = cache_accessor<float>::compute_round_up_for_shorter_interval_case
                             ((cache_entry_type *)&zi,(int)cache_1);
        iStack_48 = cache_1._4_4_;
        if ((beta_1 < -0x23) || (-0x23 < beta_1)) {
          minus_k_1 = local_f0;
          if (local_f0 < (uint)ret_value.exponent) {
            minus_k_1 = local_f0 + 1;
          }
        }
        else {
          if ((local_f0 & 1) != 0) {
            local_f0 = local_f0 - 1;
          }
          minus_k_1 = local_f0;
        }
      }
      else {
        iStack_48 = cache_1._4_4_ + 1;
        mod_inv_25 = 0;
        if (minus_k_1 == 0) {
          assert_fail("/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/fmtlib/repo/include/fmt/format-inl.h"
                      ,0x472,anon_var_dwarf_3ea58f + 9);
        }
        while( true ) {
          uVar8 = rotr(minus_k_1 * -0x3d70a3d7,2);
          ret_value_1.exponent = uVar8;
          uVar4 = max_value<unsigned_int>();
          if (uVar4 / 100 < uVar8) break;
          minus_k_1 = ret_value_1.exponent;
          mod_inv_25 = mod_inv_25 + 2;
        }
        uVar8 = rotr(minus_k_1 * -0x33333333,1);
        ret_value_1.significand = uVar8;
        uVar4 = max_value<unsigned_int>();
        if (uVar8 <= uVar4 / 10) {
          minus_k_1 = ret_value_1.significand;
          mod_inv_25 = mod_inv_25 | 1;
        }
        iStack_48 = mod_inv_25 + iStack_48;
      }
      dVar1.exponent = iStack_48;
      dVar1.significand = minus_k_1;
      return dVar1;
    }
    iVar6 = num_significand_bits<float>();
    uStack_80 = 1 << ((byte)iVar6 & 0x1f) | uStack_80;
  }
  local_86 = (uStack_80 & 1) == 0;
  local_85 = local_86;
  iVar6 = floor_log10_pow2(minus_k);
  cache._4_4_ = iVar6 + -1;
  _deltai = cache_accessor<float>::get_cached_power(-cache._4_4_);
  iVar6 = minus_k;
  iVar7 = floor_log2_pow10(-cache._4_4_);
  iVar6 = iVar6 + iVar7;
  uVar9 = cache_accessor<float>::compute_delta((cache_entry_type *)&deltai,iVar6);
  uVar4 = uStack_80 * 2;
  cVar11 = cache_accessor<float>::compute_mul
                     ((uVar4 | 1) << ((byte)iVar6 & 0x1f),(cache_entry_type *)&deltai);
  uStack_ac = cVar11.result;
  uVar8 = divide_by_10_to_kappa_plus_1(uStack_ac);
  dist = uStack_ac + uVar8 * -100;
  if (dist < uVar9) {
    if ((dist != 0) || (r._0_1_ = cVar11.is_integer, (r._0_1_ & 1U & (local_86 ^ 0xff) & 1) == 0)) {
LAB_00328ecd:
      _br = (decimal_fp<float>)CONCAT44(cache._4_4_ + 2,uVar8);
      mod_inv_25_1 = 0;
      if (uVar8 != 0) {
        while( true ) {
          uVar8 = rotr(br * -0x3d70a3d7,2);
          uVar4 = max_value<unsigned_int>();
          if (uVar4 / 100 < uVar8) break;
          br = uVar8;
          mod_inv_25_1 = mod_inv_25_1 + 2;
        }
        uVar8 = rotr(br * -0x33333333,1);
        uVar4 = max_value<unsigned_int>();
        if (uVar8 <= uVar4 / 10) {
          br = uVar8;
          mod_inv_25_1 = mod_inv_25_1 | 1;
        }
        x_local = (float)(mod_inv_25_1 + (int)x_local);
        return _br;
      }
      assert_fail("/workspace/llm4binary/github/license_c_cmakelists/openthread[P]ot-commissioner/third_party/fmtlib/repo/include/fmt/format-inl.h"
                  ,0x472,anon_var_dwarf_3ea58f + 9);
    }
    uVar8 = uVar8 - 1;
    dist = 100;
  }
  else if (dist <= uVar9) {
    cVar3 = cache_accessor<float>::compute_mul_parity(uVar4 - 1,(cache_entry_type *)&deltai,iVar6);
    approx_y_parity = cVar3.is_integer;
    if (((ushort)cVar3 & 1) != 0 || (approx_y_parity & 1U & local_85 & 1) != 0) goto LAB_00328ecd;
  }
  iVar7 = cache._4_4_ + 1;
  local_b8 = (dist - (uVar9 >> 1)) + 5;
  uVar10 = local_b8 ^ 5;
  bVar2 = check_divisibility_and_divide_by_pow10<1>(&local_b8);
  x_local = (float)iVar7;
  br = local_b8 + uVar8 * 10;
  if (bVar2) {
    cVar3 = cache_accessor<float>::compute_mul_parity(uVar4,(cache_entry_type *)&deltai,iVar6);
    local_bc = cVar3.parity;
    if ((bool)(local_bc & 1U) == ((uVar10 & 1) != 0)) {
      bStack_bb = cVar3.is_integer;
      if ((bStack_bb & 1U & ((ulong)_br & 1) != 0) != 0) {
        br = br - 1;
      }
    }
    else {
      br = br - 1;
    }
  }
  return _br;
}

Assistant:

auto to_decimal(T x) noexcept -> decimal_fp<T> {
  // Step 1: integer promotion & Schubfach multiplier calculation.

  using carrier_uint = typename float_info<T>::carrier_uint;
  using cache_entry_type = typename cache_accessor<T>::cache_entry_type;
  auto br = bit_cast<carrier_uint>(x);

  // Extract significand bits and exponent bits.
  const carrier_uint significand_mask =
      (static_cast<carrier_uint>(1) << num_significand_bits<T>()) - 1;
  carrier_uint significand = (br & significand_mask);
  int exponent =
      static_cast<int>((br & exponent_mask<T>()) >> num_significand_bits<T>());

  if (exponent != 0) {  // Check if normal.
    exponent -= exponent_bias<T>() + num_significand_bits<T>();

    // Shorter interval case; proceed like Schubfach.
    // In fact, when exponent == 1 and significand == 0, the interval is
    // regular. However, it can be shown that the end-results are anyway same.
    if (significand == 0) return shorter_interval_case<T>(exponent);

    significand |= (static_cast<carrier_uint>(1) << num_significand_bits<T>());
  } else {
    // Subnormal case; the interval is always regular.
    if (significand == 0) return {0, 0};
    exponent =
        std::numeric_limits<T>::min_exponent - num_significand_bits<T>() - 1;
  }

  const bool include_left_endpoint = (significand % 2 == 0);
  const bool include_right_endpoint = include_left_endpoint;

  // Compute k and beta.
  const int minus_k = floor_log10_pow2(exponent) - float_info<T>::kappa;
  const cache_entry_type cache = cache_accessor<T>::get_cached_power(-minus_k);
  const int beta = exponent + floor_log2_pow10(-minus_k);

  // Compute zi and deltai.
  // 10^kappa <= deltai < 10^(kappa + 1)
  const uint32_t deltai = cache_accessor<T>::compute_delta(cache, beta);
  const carrier_uint two_fc = significand << 1;

  // For the case of binary32, the result of integer check is not correct for
  // 29711844 * 2^-82
  // = 6.1442653300000000008655037797566933477355632930994033813476... * 10^-18
  // and 29711844 * 2^-81
  // = 1.2288530660000000001731007559513386695471126586198806762695... * 10^-17,
  // and they are the unique counterexamples. However, since 29711844 is even,
  // this does not cause any problem for the endpoints calculations; it can only
  // cause a problem when we need to perform integer check for the center.
  // Fortunately, with these inputs, that branch is never executed, so we are
  // fine.
  const typename cache_accessor<T>::compute_mul_result z_mul =
      cache_accessor<T>::compute_mul((two_fc | 1) << beta, cache);

  // Step 2: Try larger divisor; remove trailing zeros if necessary.

  // Using an upper bound on zi, we might be able to optimize the division
  // better than the compiler; we are computing zi / big_divisor here.
  decimal_fp<T> ret_value;
  ret_value.significand = divide_by_10_to_kappa_plus_1(z_mul.result);
  uint32_t r = static_cast<uint32_t>(z_mul.result - float_info<T>::big_divisor *
                                                        ret_value.significand);

  if (r < deltai) {
    // Exclude the right endpoint if necessary.
    if (r == 0 && (z_mul.is_integer & !include_right_endpoint)) {
      --ret_value.significand;
      r = float_info<T>::big_divisor;
      goto small_divisor_case_label;
    }
  } else if (r > deltai) {
    goto small_divisor_case_label;
  } else {
    // r == deltai; compare fractional parts.
    const typename cache_accessor<T>::compute_mul_parity_result x_mul =
        cache_accessor<T>::compute_mul_parity(two_fc - 1, cache, beta);

    if (!(x_mul.parity | (x_mul.is_integer & include_left_endpoint)))
      goto small_divisor_case_label;
  }
  ret_value.exponent = minus_k + float_info<T>::kappa + 1;

  // We may need to remove trailing zeros.
  ret_value.exponent += remove_trailing_zeros(ret_value.significand);
  return ret_value;

  // Step 3: Find the significand with the smaller divisor.

small_divisor_case_label:
  ret_value.significand *= 10;
  ret_value.exponent = minus_k + float_info<T>::kappa;

  uint32_t dist = r - (deltai / 2) + (float_info<T>::small_divisor / 2);
  const bool approx_y_parity =
      ((dist ^ (float_info<T>::small_divisor / 2)) & 1) != 0;

  // Is dist divisible by 10^kappa?
  const bool divisible_by_small_divisor =
      check_divisibility_and_divide_by_pow10<float_info<T>::kappa>(dist);

  // Add dist / 10^kappa to the significand.
  ret_value.significand += dist;

  if (!divisible_by_small_divisor) return ret_value;

  // Check z^(f) >= epsilon^(f).
  // We have either yi == zi - epsiloni or yi == (zi - epsiloni) - 1,
  // where yi == zi - epsiloni if and only if z^(f) >= epsilon^(f).
  // Since there are only 2 possibilities, we only need to care about the
  // parity. Also, zi and r should have the same parity since the divisor
  // is an even number.
  const auto y_mul = cache_accessor<T>::compute_mul_parity(two_fc, cache, beta);

  // If z^(f) >= epsilon^(f), we might have a tie when z^(f) == epsilon^(f),
  // or equivalently, when y is an integer.
  if (y_mul.parity != approx_y_parity)
    --ret_value.significand;
  else if (y_mul.is_integer & (ret_value.significand % 2 != 0))
    --ret_value.significand;
  return ret_value;
}